

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

int __thiscall
TPZMatrix<std::complex<long_double>_>::Subst_Backward
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *B)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar7;
  unkbyte10 in_ST0;
  unkbyte10 Var8;
  unkbyte10 in_ST1;
  unkbyte10 Var9;
  longdouble lVar10;
  unkbyte10 in_ST2;
  longdouble lVar11;
  unkbyte10 in_ST3;
  complex<long_double> __r;
  complex<long_double> pivot;
  unkbyte10 Var12;
  unkbyte10 Var13;
  complex<long_double> local_b8;
  undefined8 local_98 [4];
  unkbyte10 local_78;
  unkbyte10 local_68;
  complex<long_double> local_58;
  
  lVar4 = (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar3 = 0;
  if ((lVar4 == CONCAT44(extraout_var,iVar2)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
    iVar3 = 1;
    if (CONCAT44(extraout_var_00,iVar2) != 0 && -1 < extraout_var_00) {
      lVar4 = CONCAT44(extraout_var_00,iVar2);
      do {
        lVar5 = lVar4 + -1;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_78,this,lVar5,lVar5);
        if (0 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol) {
          lVar7 = 0;
          do {
            iVar2 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
            lVar6 = CONCAT44(extraout_var_01,iVar2);
            lVar11 = (longdouble)0;
            lVar10 = lVar11;
            Var8 = in_ST0;
            Var9 = in_ST1;
            if (lVar4 < lVar6) {
              lVar11 = (longdouble)0;
              lVar10 = lVar11;
              do {
                lVar6 = lVar6 + -1;
                (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                          (local_98,this,lVar5,lVar6);
                (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.
                  super_TPZSavable._vptr_TPZSavable[0x24])(&local_58,B,lVar6,lVar7);
                local_b8._M_value._16_8_ = local_98[2];
                local_b8._M_value._24_2_ = (undefined2)local_98[3];
                local_b8._M_value._26_4_ = local_98[3]._2_4_;
                local_b8._M_value._30_2_ = local_98[3]._6_2_;
                local_b8._M_value._0_8_ = local_98[0];
                local_b8._M_value._8_2_ = (undefined2)local_98[1];
                local_b8._M_value._10_4_ = local_98[1]._2_4_;
                local_b8._M_value._14_2_ = local_98[1]._6_2_;
                std::complex<long_double>::operator*=(&local_b8,&local_58);
                lVar11 = (longdouble)CONCAT28(local_b8._M_value._8_2_,local_b8._M_value._0_8_) +
                         lVar11;
                lVar10 = (longdouble)CONCAT28(local_b8._M_value._24_2_,local_b8._M_value._16_8_) +
                         lVar10;
              } while (lVar4 < lVar6);
            }
            in_ST1 = in_ST3;
            in_ST0 = in_ST2;
            (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(local_98,B,lVar5,lVar7);
            lVar11 = (longdouble)CONCAT28((undefined2)local_98[1],local_98[0]) - lVar11;
            local_b8._M_value._14_2_ = local_98[1]._6_2_;
            local_b8._M_value._10_4_ = local_98[1]._2_4_;
            lVar10 = (longdouble)CONCAT28((undefined2)local_98[3],local_98[2]) - lVar10;
            local_b8._M_value._30_2_ = local_98[3]._6_2_;
            local_b8._M_value._26_4_ = local_98[3]._2_4_;
            local_b8._M_value._0_8_ = SUB108(lVar11,0);
            local_b8._M_value._8_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
            local_b8._M_value._16_8_ = SUB108(lVar10,0);
            local_b8._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
            in_ST2 = in_ST1;
            in_ST3 = in_ST1;
            Var12 = local_78;
            Var13 = local_68;
            __divxc3();
            local_b8._M_value._0_8_ = SUB108(Var8,0);
            local_b8._M_value._8_2_ = SUB102((unkuint10)Var8 >> 0x40,0);
            local_b8._M_value._16_8_ = SUB108(Var9,0);
            local_b8._M_value._24_2_ = SUB102((unkuint10)Var9 >> 0x40,0);
            (*(B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x23])(B,lVar5,lVar7,&local_b8,in_R8,in_R9,lVar11,lVar10,Var12,Var13)
            ;
            lVar7 = lVar7 + 1;
          } while (lVar7 < (B->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol
                  );
        }
        bVar1 = 1 < lVar4;
        lVar4 = lVar5;
      } while (bVar1);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int TPZMatrix<TVar>::Subst_Backward( TPZFMatrix<TVar> *B ) const {
	
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky) return( 0 );
	for ( int64_t r = Dim()-1;  r >= 0;  r-- ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols(); c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = N, ..., r+1.
			//
			TVar sum = 0.0;
			for ( int64_t i = Dim()-1; i > r; i-- ) sum += GetVal(r, i) * B->GetVal(i, c);
            // Faz B[r,c] = (B[r,c] - sum) / A[r,r].
            //
            B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
        }
    }
    return( 1 );
}